

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1540.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  timeval tVar5;
  CURLcode ec_8;
  CURLcode ec_7;
  CURLcode ec_6;
  CURLcode ec_5;
  CURLcode ec_4;
  CURLcode ec_3;
  CURLcode ec_2;
  CURLcode ec_1;
  CURLcode ec;
  __suseconds_t local_48;
  long local_40;
  transfer_status st;
  int res;
  int i;
  CURL *curls;
  char *URL_local;
  
  st._20_4_ = 0;
  st.please = 0;
  tVar5 = tutil_tvnow();
  _ec_1 = tVar5.tv_sec;
  tv_test_start.tv_sec = _ec_1;
  local_48 = tVar5.tv_usec;
  tv_test_start.tv_usec = local_48;
  memset(&local_40,0,0x18);
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 != 0) {
    uVar3 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1540.c"
                  ,0x5d,iVar2,uVar3);
    st.please = iVar2;
  }
  if (st.please == 0) {
    lVar4 = curl_easy_init();
    if (lVar4 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1540.c"
                    ,0x5f);
      st.please = 0x7c;
    }
    if (st.please == 0) {
      local_40 = lVar4;
      iVar2 = curl_easy_setopt(lVar4,0x2712,URL);
      uVar1 = _stderr;
      if (iVar2 != 0) {
        uVar3 = curl_easy_strerror(iVar2);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1540.c"
                      ,0x62,iVar2,uVar3);
        st.please = iVar2;
      }
      if (st.please == 0) {
        iVar2 = curl_easy_setopt(lVar4,0x4e2b,write_callback);
        uVar1 = _stderr;
        if (iVar2 != 0) {
          uVar3 = curl_easy_strerror(iVar2);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1540.c"
                        ,99,iVar2,uVar3);
          st.please = iVar2;
        }
        if (st.please == 0) {
          iVar2 = curl_easy_setopt(lVar4,0x2711,&local_40);
          uVar1 = _stderr;
          if (iVar2 != 0) {
            uVar3 = curl_easy_strerror(iVar2);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1540.c"
                          ,100,iVar2,uVar3);
            st.please = iVar2;
          }
          if (st.please == 0) {
            iVar2 = curl_easy_setopt(lVar4,0x4e6f,header_callback);
            uVar1 = _stderr;
            if (iVar2 != 0) {
              uVar3 = curl_easy_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1540.c"
                            ,0x65,iVar2,uVar3);
              st.please = iVar2;
            }
            if (st.please == 0) {
              iVar2 = curl_easy_setopt(lVar4,0x272d,&local_40);
              uVar1 = _stderr;
              if (iVar2 != 0) {
                uVar3 = curl_easy_strerror(iVar2);
                curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1540.c"
                              ,0x66,iVar2,uVar3);
                st.please = iVar2;
              }
              if (st.please == 0) {
                iVar2 = curl_easy_setopt(lVar4,0x4efb,please_continue);
                uVar1 = _stderr;
                if (iVar2 != 0) {
                  uVar3 = curl_easy_strerror(iVar2);
                  curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1540.c"
                                ,0x68,iVar2,uVar3);
                  st.please = iVar2;
                }
                if (st.please == 0) {
                  iVar2 = curl_easy_setopt(lVar4,0x2749,&local_40);
                  uVar1 = _stderr;
                  if (iVar2 != 0) {
                    uVar3 = curl_easy_strerror(iVar2);
                    curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1540.c"
                                  ,0x69,iVar2,uVar3);
                    st.please = iVar2;
                  }
                  if (st.please == 0) {
                    iVar2 = curl_easy_setopt(lVar4,0x2b,0);
                    uVar1 = _stderr;
                    if (iVar2 != 0) {
                      uVar3 = curl_easy_strerror(iVar2);
                      curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1540.c"
                                    ,0x6a,iVar2,uVar3);
                      st.please = iVar2;
                    }
                    if (st.please == 0) {
                      st.please = curl_easy_perform(lVar4);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    curl_easy_cleanup(lVar4);
    curl_global_cleanup();
    if (st.please != 0) {
      st._20_4_ = st.please;
    }
    URL_local._4_4_ = st._20_4_;
  }
  else {
    URL_local._4_4_ = st.please;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *curls = NULL;
  int i = 0;
  int res = 0;
  struct transfer_status st;

  start_test_timing();

  memset(&st, 0, sizeof(st));

  global_init(CURL_GLOBAL_ALL);

  easy_init(curls);
  st.easy = curls; /* to allow callbacks access */

  easy_setopt(curls, CURLOPT_URL, URL);
  easy_setopt(curls, CURLOPT_WRITEFUNCTION, write_callback);
  easy_setopt(curls, CURLOPT_WRITEDATA, &st);
  easy_setopt(curls, CURLOPT_HEADERFUNCTION, header_callback);
  easy_setopt(curls, CURLOPT_HEADERDATA, &st);

  easy_setopt(curls, CURLOPT_XFERINFOFUNCTION, please_continue);
  easy_setopt(curls, CURLOPT_XFERINFODATA, &st);
  easy_setopt(curls, CURLOPT_NOPROGRESS, 0L);

  res = curl_easy_perform(curls);

test_cleanup:

  curl_easy_cleanup(curls);
  curl_global_cleanup();

  if(res)
    i = res;

  return i; /* return the final return code */
}